

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

cram_codec *
cram_huffman_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  cram_codec *__ptr;
  void *__ptr_00;
  void *pvVar4;
  kh_m_i2i_t *pkVar5;
  void *__ptr_01;
  cram_huffman_code *__base;
  int iVar6;
  int iVar7;
  ulong uVar8;
  code *pcVar9;
  khint_t kVar10;
  ulong uVar11;
  code *pcVar12;
  uint uVar13;
  ulong uVar14;
  size_t __nmemb;
  uint uVar15;
  long lVar16;
  byte bVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  
  __ptr = (cram_codec *)malloc(0x240);
  uVar13 = 0;
  if (__ptr != (cram_codec *)0x0) {
    __ptr->codec = E_HUFFMAN;
    lVar16 = 0;
    __ptr_00 = (void *)0x0;
    pvVar4 = (void *)0x0;
    iVar18 = 0;
    do {
      if (st->freqs[lVar16] != 0) {
        if (iVar18 <= (int)uVar13) {
          bVar20 = iVar18 == 0;
          iVar18 = iVar18 * 2;
          if (bVar20) {
            iVar18 = 0x400;
          }
          __ptr_00 = realloc(__ptr_00,(long)iVar18 << 2);
          pvVar4 = realloc(pvVar4,(long)iVar18 << 2);
          if ((__ptr_00 == (void *)0x0) || (pvVar4 == (void *)0x0)) {
            if (__ptr_00 != (void *)0x0) {
              free(__ptr_00);
            }
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
            free(__ptr);
            return (cram_codec *)0x0;
          }
        }
        *(int *)((long)__ptr_00 + (long)(int)uVar13 * 4) = (int)lVar16;
        iVar6 = st->freqs[lVar16];
        *(int *)((long)pvVar4 + (long)(int)uVar13 * 4) = iVar6;
        if (iVar6 < 1) {
          __assert_fail("st->freqs[i] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                        ,0x4cb,
                        "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                       );
        }
        uVar13 = uVar13 + 1;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x400);
    pkVar5 = st->h;
    if ((pkVar5 != (kh_m_i2i_t *)0x0) && (kVar10 = pkVar5->n_buckets, kVar10 != 0)) {
      bVar17 = 0;
      uVar15 = 0;
      do {
        if ((pkVar5->flags[uVar15 >> 4] >> (bVar17 & 0x1e) & 3) == 0) {
          if (iVar18 <= (int)uVar13) {
            bVar20 = iVar18 == 0;
            iVar18 = iVar18 * 2;
            if (bVar20) {
              iVar18 = 0x400;
            }
            __ptr_00 = realloc(__ptr_00,(long)iVar18 << 2);
            pvVar4 = realloc(pvVar4,(long)iVar18 << 2);
            if (__ptr_00 == (void *)0x0) {
              return (cram_codec *)0x0;
            }
            if (pvVar4 == (void *)0x0) {
              return (cram_codec *)0x0;
            }
            pkVar5 = st->h;
          }
          *(khint32_t *)((long)__ptr_00 + (long)(int)uVar13 * 4) = pkVar5->keys[uVar15];
          iVar6 = pkVar5->vals[uVar15];
          *(int *)((long)pvVar4 + (long)(int)uVar13 * 4) = iVar6;
          if (iVar6 < 1) {
            __assert_fail("freqs[nvals] > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                          ,0x4e0,
                          "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                         );
          }
          uVar13 = uVar13 + 1;
          kVar10 = pkVar5->n_buckets;
        }
        uVar15 = uVar15 + 1;
        bVar17 = bVar17 + 2;
      } while (uVar15 != kVar10);
    }
    if ((int)uVar13 < 1) {
      __assert_fail("nvals > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                    ,0x4e8,
                    "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                   );
    }
    pvVar4 = realloc(pvVar4,(ulong)(uVar13 * 2) * 4);
    __ptr_01 = calloc((ulong)(uVar13 * 2),4);
    if (pvVar4 == (void *)0x0) {
      return (cram_codec *)0x0;
    }
    if (__ptr_01 == (void *)0x0) {
      return (cram_codec *)0x0;
    }
    uVar19 = (ulong)uVar13;
    while( true ) {
      uVar11 = 0;
      uVar8 = 0;
      uVar14 = 0;
      iVar6 = 0x7fffffff;
      iVar18 = 0x7fffffff;
      do {
        iVar7 = *(int *)((long)pvVar4 + uVar11 * 4);
        iVar2 = iVar6;
        iVar3 = iVar18;
        if (-1 < iVar7) {
          if (iVar7 < iVar6) {
            uVar8 = uVar14;
            uVar14 = uVar11 & 0xffffffff;
            iVar2 = iVar7;
            iVar3 = iVar6;
          }
          else {
            if (iVar7 <= iVar18) {
              iVar3 = iVar7;
            }
            if (iVar7 < iVar18) {
              uVar8 = uVar11 & 0xffffffff;
            }
          }
        }
        iVar6 = iVar2;
        uVar11 = uVar11 + 1;
        iVar18 = iVar3;
      } while (uVar11 < uVar19);
      uVar13 = (uint)uVar19;
      if (iVar3 == 0x7fffffff) break;
      *(int *)((long)pvVar4 + uVar19 * 4) = iVar3 + iVar6;
      *(uint *)((long)__ptr_01 + (long)(int)uVar14 * 4) = uVar13;
      *(uint *)((long)__ptr_01 + (long)(int)uVar8 * 4) = uVar13;
      piVar1 = (int *)((long)pvVar4 + (long)(int)uVar14 * 4);
      *piVar1 = -*piVar1;
      piVar1 = (int *)((long)pvVar4 + (long)(int)uVar8 * 4);
      *piVar1 = -*piVar1;
      uVar19 = uVar19 + 1;
    }
    uVar14 = uVar19 >> 1 & 0x7fffffff;
    uVar8 = (ulong)((uVar13 >> 1) + 1);
    uVar19 = 0;
    do {
      iVar18 = *(int *)((long)__ptr_01 + uVar19 * 4);
      iVar6 = 0;
      if (iVar18 != 0) {
        iVar6 = 0;
        do {
          iVar6 = iVar6 + 1;
          iVar18 = *(int *)((long)__ptr_01 + (long)iVar18 * 4);
        } while (iVar18 != 0);
      }
      piVar1 = (int *)((long)pvVar4 + uVar19 * 4);
      *piVar1 = -*piVar1;
      *(int *)((long)__ptr_01 + uVar19 * 4) = iVar6;
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar8);
    __nmemb = uVar14 + 1;
    __base = (cram_huffman_code *)malloc(__nmemb * 0x10);
    if (__base != (cram_huffman_code *)0x0) {
      lVar16 = 0;
      do {
        (&__base->symbol)[lVar16] = *(int32_t *)((long)__ptr_00 + lVar16);
        (&__base->len)[lVar16] = *(int32_t *)((long)__ptr_01 + lVar16);
        lVar16 = lVar16 + 4;
      } while ((ulong)(uVar13 >> 1) * 4 + 4 != lVar16);
      qsort(__base,__nmemb,0x10,code_sort);
      iVar18 = __base->len;
      uVar19 = 0;
      iVar6 = 0;
      do {
        for (iVar7 = iVar18; iVar7 != __base[uVar19].len; iVar7 = iVar7 + 1) {
          iVar6 = iVar6 * 2;
          iVar18 = __base[uVar19].len;
        }
        __base[uVar19].code = iVar6;
        uVar13 = __base[uVar19].symbol + 1;
        if (uVar13 < 0x81) {
          *(int *)((long)&__ptr->field_6 + (ulong)uVar13 * 4 + 0xc) = (int)uVar19;
        }
        iVar6 = iVar6 + 1;
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar8);
      free(__ptr_01);
      free(__ptr_00);
      free(pvVar4);
      (__ptr->field_6).e_huffman.codes = __base;
      (__ptr->field_6).e_huffman.nvals = (int)uVar14 + 1;
      bVar20 = __base->len == 0;
      pcVar9 = cram_huffman_encode_char;
      if (bVar20) {
        pcVar9 = cram_huffman_encode_char0;
      }
      pcVar12 = cram_huffman_encode_int;
      if (bVar20) {
        pcVar12 = cram_huffman_encode_int0;
      }
      __ptr->free = cram_huffman_encode_free;
      if (option - E_BYTE < 2) {
        pcVar12 = pcVar9;
      }
      __ptr->encode = pcVar12;
      __ptr->store = cram_huffman_encode_store;
      return __ptr;
    }
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_huffman_encode_init(cram_stats *st,
				     enum cram_external_type option,
				     void *dat,
				     int version) {
    int *vals = NULL, *freqs = NULL, vals_alloc = 0, *lens, code, len;
    int nvals, i, ntot = 0, max_val = 0, min_val = INT_MAX, k;
    cram_codec *c;
    cram_huffman_code *codes;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec = E_HUFFMAN;

    /* Count number of unique symbols */
    for (nvals = i = 0; i < MAX_STAT_VAL; i++) {
	if (!st->freqs[i])
	    continue;
	if (nvals >= vals_alloc) {
	    vals_alloc = vals_alloc ? vals_alloc*2 : 1024;
	    vals  = realloc(vals,  vals_alloc * sizeof(int));
	    freqs = realloc(freqs, vals_alloc * sizeof(int));
	    if (!vals || !freqs) {
		if (vals)  free(vals);
		if (freqs) free(freqs);
		free(c);
		return NULL;
	    }
	}
	vals[nvals] = i;
	freqs[nvals] = st->freqs[i];
	assert(st->freqs[i] > 0);
	ntot += freqs[nvals];
	if (max_val < i) max_val = i;
	if (min_val > i) min_val = i;
	nvals++;
    }
    if (st->h) {
	khint_t k;

	for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
	    if (!kh_exist(st->h, k))
		continue;
	    if (nvals >= vals_alloc) {
		vals_alloc = vals_alloc ? vals_alloc*2 : 1024;
		vals  = realloc(vals,  vals_alloc * sizeof(int));
		freqs = realloc(freqs, vals_alloc * sizeof(int));
		if (!vals || !freqs)
		    return NULL;
	    }
	    vals[nvals]= kh_key(st->h, k);
	    freqs[nvals] = kh_val(st->h, k);
	    assert(freqs[nvals] > 0);
	    ntot += freqs[nvals];
	    if (max_val < i) max_val = i;
	    if (min_val > i) min_val = i;
	    nvals++;
	}
    }

    assert(nvals > 0);

    freqs = realloc(freqs, 2*nvals*sizeof(*freqs));
    lens = calloc(2*nvals, sizeof(*lens));
    if (!lens || !freqs)
	return NULL;

    /* Inefficient, use pointers to form chain so we can insert and maintain
     * a sorted list? This is currently O(nvals^2) complexity.
     */
    for (;;) {
	int low1 = INT_MAX, low2 = INT_MAX;
	int ind1 = 0, ind2 = 0;
	for (i = 0; i < nvals; i++) {
	    if (freqs[i] < 0)
		continue;
	    if (low1 > freqs[i]) 
		low2 = low1, ind2 = ind1, low1 = freqs[i], ind1 = i;
	    else if (low2 > freqs[i])
		low2 = freqs[i], ind2 = i;
	}
	if (low2 == INT_MAX)
	    break;

	freqs[nvals] = low1 + low2;
	lens[ind1] = nvals;
	lens[ind2] = nvals;
	freqs[ind1] *= -1;
	freqs[ind2] *= -1;
	nvals++;
    }
    nvals = nvals/2+1;

    /* Assign lengths */
    for (i = 0; i < nvals; i++) {
	int code_len = 0;
	for (k = lens[i]; k; k = lens[k])
	    code_len++;
	lens[i] = code_len;
	freqs[i] *= -1;
	//fprintf(stderr, "%d / %d => %d\n", vals[i], freqs[i], lens[i]);
    }


    /* Sort, need in a struct */
    if (!(codes = malloc(nvals * sizeof(*codes))))
	return NULL;
    for (i = 0; i < nvals; i++) {
	codes[i].symbol = vals[i];
	codes[i].len = lens[i];
    }
    qsort(codes, nvals, sizeof(*codes), code_sort);

    /*
     * Generate canonical codes from lengths.
     * Sort by length.
     * Start with 0.
     * Every new code of same length is +1.
     * Every new code of new length is +1 then <<1 per extra length.
     *
     * /\
     * a/\
     * /\/\
     * bcd/\
     *    ef
     * 
     * a 1  0
     * b 3  4 (0+1)<<2
     * c 3  5
     * d 3  6
     * e 4  14  (6+1)<<1
     * f 5  15     
     */
    code = 0; len = codes[0].len;
    for (i = 0; i < nvals; i++) {
	while (len != codes[i].len) {
	    code<<=1;
	    len++;
	}
	codes[i].code = code++;

	if (codes[i].symbol >= -1 && codes[i].symbol < MAX_HUFF)
	    c->e_huffman.val2code[codes[i].symbol+1] = i;

	//fprintf(stderr, "sym %d, code %d, len %d\n",
	//	codes[i].symbol, codes[i].code, codes[i].len);
    }

    free(lens);
    free(vals);
    free(freqs);

    c->e_huffman.codes = codes;
    c->e_huffman.nvals = nvals;

    c->free = cram_huffman_encode_free;
    if (option == E_BYTE || option == E_BYTE_ARRAY) {
	if (c->e_huffman.codes[0].len == 0)
	    c->encode = cram_huffman_encode_char0;
	else
	    c->encode = cram_huffman_encode_char;
    } else {
	if (c->e_huffman.codes[0].len == 0)
	    c->encode = cram_huffman_encode_int0;
	else
	    c->encode = cram_huffman_encode_int;
    }
    c->store = cram_huffman_encode_store;

    return c;
}